

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Versions.cpp
# Opt level: O2

void __thiscall
glslang::TParseVersions::extensionRequires
          (TParseVersions *this,TSourceLoc *loc,char *extension,char *behaviorString)

{
  pointer pbVar1;
  int iVar2;
  iterator iVar3;
  ulong uVar4;
  pointer __str;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> ext;
  pool_allocator<char> local_60;
  key_type local_58;
  
  iVar2 = strcmp("require",behaviorString);
  if (iVar2 != 0) {
    iVar2 = strcmp("enable",behaviorString);
    if (iVar2 != 0) goto LAB_002f6df1;
  }
  local_60.allocator = GetThreadPoolAllocator();
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_58,
             extension,&local_60);
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_unsigned_int>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_unsigned_int>_>_>
                  *)&this->extensionMinSpv,&local_58);
  if ((_Rb_tree_header *)iVar3._M_node ==
      &(this->extensionMinSpv).
       super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_unsigned_int>_>_>
       ._M_t._M_impl.super__Rb_tree_header) {
    uVar4 = 0;
  }
  else {
    uVar4 = (ulong)*(uint *)&iVar3._M_node[2]._M_parent;
  }
  (*this->_vptr_TParseVersions[0x2c])(this,loc,extension,uVar4);
LAB_002f6df1:
  if ((this->spvVersion).spv != 0) {
    pbVar1 = (this->spvUnsupportedExt).
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (__str = (this->spvUnsupportedExt).
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; __str != pbVar1; __str = __str + 1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      basic_string(&local_58,__str);
      iVar2 = strcmp(extension,local_58._M_dataplus._M_p);
      if (iVar2 == 0) {
        (*this->_vptr_TParseVersions[0x2d])
                  (this,loc,"not allowed when using generating SPIR-V codes",extension,"");
      }
    }
  }
  return;
}

Assistant:

void TParseVersions::extensionRequires(const TSourceLoc &loc, const char * const extension, const char *behaviorString)
{
    bool isEnabled = false;
    if (!strcmp("require", behaviorString))
        isEnabled = true;
    else if (!strcmp("enable", behaviorString))
        isEnabled = true;

    if (isEnabled) {
        unsigned int minSpvVersion = 0;
        auto iter = extensionMinSpv.find(TString(extension));
        if (iter != extensionMinSpv.end())
            minSpvVersion = iter->second;
        requireSpv(loc, extension, minSpvVersion);
    }

    if (spvVersion.spv != 0){
        for (auto ext : spvUnsupportedExt){
            if (strcmp(extension, ext.c_str()) == 0)
                error(loc, "not allowed when using generating SPIR-V codes", extension, "");
        }
    }
}